

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLineCam::ArchiveIN(ChLineCam *this,ChArchiveIn *marchive)

{
  eChCamType_mapper mmapper;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChEnumMapper<chrono::geometry::eChCamType> local_78;
  eChCamType_mapper local_58;
  shared_ptr<chrono::ChFunction> local_38;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineCam>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  eChCamType_mapper::eChCamType_mapper(&local_58);
  eChCamType_mapper::operator()(&local_78,&local_58,&this->type);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0xa1cf0c;
  local_28 = 0;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_38);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b66258
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eChCamType *)&this->law;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040a4;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChCamType *)&this->phase;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa147c3;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->Rb;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040a8;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->Rr;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040ab;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->p;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa1831f;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->d;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x97f505;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->b0;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040ae;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->e;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa1d110;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->s;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x98536e;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  local_78.value_ptr = (eChCamType *)&this->negative;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040b1;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_78.value_ptr = (eChCamType *)&this->internal;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa040ba;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->center;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0xa1ad87;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_78.value_ptr = (eChCamType *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b66258;
  if (local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::geometry::eChCamType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::geometry::eChCamType>,_std::allocator<chrono::ChEnumNamePair<chrono::geometry::eChCamType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLineCam::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineCam>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    eChCamType_mapper mmapper;
    marchive >> CHNVP(mmapper(type), "type");
    marchive >> CHNVP(law);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(Rb);
    marchive >> CHNVP(Rr);
    marchive >> CHNVP(p);
    marchive >> CHNVP(d);
    marchive >> CHNVP(b0);
    marchive >> CHNVP(e);
    marchive >> CHNVP(s);
    marchive >> CHNVP(negative);
    marchive >> CHNVP(internal);
    marchive >> CHNVP(center);
}